

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall google::protobuf::Reflection::Swap(Reflection *this,Message *lhs,Message *rhs)

{
  MessageLite *from;
  MessageLite *pMVar1;
  string *psVar2;
  LogMessage *pLVar3;
  Arena *arena;
  Arena *pAVar4;
  Metadata MVar5;
  LogMessageFatal local_40 [16];
  
  while( true ) {
    if (lhs == rhs) {
      return;
    }
    pAVar4 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    MVar5 = Message::GetMetadata(lhs);
    if (MVar5.reflection == this) {
      psVar2 = (string *)0x0;
    }
    else {
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                         (MVar5.reflection,this,"lhs->GetReflection() == this");
    }
    if (psVar2 != (string *)0x0) break;
    MVar5 = Message::GetMetadata(rhs);
    if (MVar5.reflection == this) {
      psVar2 = (string *)0x0;
    }
    else {
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                         (MVar5.reflection,this,"rhs->GetReflection() == this");
    }
    if (psVar2 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x43d,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (local_40,0x24,"Second argument to Swap() (of type \"");
      MVar5 = Message::GetMetadata(rhs);
      pLVar3 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)local_40,(string *)((MVar5.descriptor)->all_names_ + 1));
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (pLVar3,0x45,
                 "\") is not compatible with this reflection object (which is for type \"");
      pLVar3 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(string *)(this->descriptor_->all_names_ + 1));
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (pLVar3,(char (*) [79])
                        "\").  Note that the exact same class is required; not just the same descriptor."
                );
      goto LAB_002770c7;
    }
    if (pAVar4 == arena) {
      UnsafeArenaSwap(this,lhs,rhs);
      return;
    }
    from = &lhs->super_MessageLite;
    pMVar1 = &rhs->super_MessageLite;
    if (pAVar4 != (Arena *)0x0) {
      arena = pAVar4;
      from = &rhs->super_MessageLite;
      pMVar1 = &lhs->super_MessageLite;
    }
    lhs = (Message *)pMVar1;
    rhs = (Message *)MessageLite::New(&lhs->super_MessageLite,arena);
    Message::MergeFrom(rhs,(Message *)from);
    Message::CopyFrom((Message *)from,lhs);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
             ,0x435,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_40,0x23,"First argument to Swap() (of type \"");
  MVar5 = Message::GetMetadata(lhs);
  pLVar3 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<
                     ((LogMessage *)local_40,(string *)((MVar5.descriptor)->all_names_ + 1));
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (pLVar3,0x45,"\") is not compatible with this reflection object (which is for type \"");
  pLVar3 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar3,(string *)(this->descriptor_->all_names_ + 1));
  absl::lts_20240722::log_internal::LogMessage::operator<<
            (pLVar3,(char (*) [79])
                    "\").  Note that the exact same class is required; not just the same descriptor."
            );
LAB_002770c7:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

void Reflection::Swap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();

  // TODO:  Other Reflection methods should probably check this too.
  ABSL_CHECK_EQ(lhs->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << lhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  ABSL_CHECK_EQ(rhs->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << rhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (!internal::CanUseInternalSwap(lhs_arena, rhs_arena)) {
    // One of the two is guaranteed to have an arena.  Switch things around
    // to guarantee that lhs has an arena.
    Arena* arena = lhs_arena;
    if (arena == nullptr) {
      arena = rhs_arena;
      std::swap(lhs, rhs);  // Swapping names for pointers!
    }

    Message* temp = lhs->New(arena);
    temp->MergeFrom(*rhs);
    rhs->CopyFrom(*lhs);
    if (internal::DebugHardenForceCopyInSwap()) {
      lhs->CopyFrom(*temp);
      if (arena == nullptr) delete temp;
    } else {
      Swap(lhs, temp);
    }
    return;
  }

  UnsafeArenaSwap(lhs, rhs);
}